

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O0

void __thiscall ImplSimd<SimdAVX>::YUV2RGB(ImplSimd<SimdAVX> *this,YUV420 *yuv,RGB *rgb)

{
  long *in_RDX;
  long *in_RSI;
  uint8_t *puVar1;
  undefined8 extraout_XMM0_Qa;
  uint8_t *extraout_XMM0_Qb;
  VectorType *b_00;
  undefined8 in_YMM0_H;
  VectorType *a;
  undefined8 in_register_00001218;
  Vector e;
  Vector d;
  Vector c;
  size_t i;
  uint8_t *b;
  uint8_t *g;
  uint8_t *r;
  uint8_t *v;
  uint8_t *u;
  uint8_t *y;
  undefined8 in_stack_fffffffffffffb00;
  int imm8;
  VectorType *in_stack_fffffffffffffb08;
  VectorType *in_stack_fffffffffffffb10;
  uint8_t *in_stack_fffffffffffffb68;
  VectorType *in_stack_fffffffffffffb70;
  uint8_t local_140 [16];
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  uint8_t local_e0 [16];
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_90;
  undefined8 uStack_88;
  ulong local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long *local_40;
  
  if (in_RSI[1] != *in_RDX) {
    __assert_fail("yuv->height_ == rgb->height_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x1f,"virtual void ImplSimd<SimdAVX>::YUV2RGB(YUV420 *, RGB *) [SIMD = SimdAVX]")
    ;
  }
  if (*in_RSI == in_RDX[1]) {
    if ((in_RSI[2] & 0xfU) == 0) {
      local_50 = in_RSI[3];
      local_58 = in_RSI[4];
      local_60 = in_RSI[5];
      local_68 = in_RDX[3];
      local_70 = in_RDX[4];
      local_78 = in_RDX[5];
      local_40 = in_RSI;
      for (local_80 = 0; local_80 < (ulong)local_40[2]; local_80 = local_80 + 0x10) {
        SimdAVX::Load((VectorType *)(local_50 + local_80),(uint8_t *)in_RSI);
        uStack_b0 = in_YMM0_H;
        uStack_a8 = in_register_00001218;
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        puVar1 = local_e0;
        uStack_d0 = in_YMM0_H;
        uStack_c8 = in_register_00001218;
        SimdAVX::Sub(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        uStack_90 = in_YMM0_H;
        uStack_88 = in_register_00001218;
        SimdAVX::Load((VectorType *)(local_58 + local_80),puVar1);
        uStack_110 = in_YMM0_H;
        uStack_108 = in_register_00001218;
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        puVar1 = local_140;
        uStack_130 = in_YMM0_H;
        uStack_128 = in_register_00001218;
        SimdAVX::Sub(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        uStack_f0 = in_YMM0_H;
        uStack_e8 = in_register_00001218;
        SimdAVX::Load((VectorType *)(local_60 + local_80),puVar1);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        SimdAVX::Sub(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        SimdAVX::Add(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        SimdAVX::Add(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        imm8 = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
        SimdAVX::Rli(in_stack_fffffffffffffb08,imm8);
        SimdAVX::Store(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        SimdAVX::Sub(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        SimdAVX::Sub(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        SimdAVX::Add(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        SimdAVX::Rli(in_stack_fffffffffffffb08,imm8);
        a = (VectorType *)0x0;
        SimdAVX::Store(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        in_stack_fffffffffffffb68 = extraout_XMM0_Qb;
        in_stack_fffffffffffffb70 = a;
        SimdAVX::Mul(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        SimdAVX::Mul(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        SimdAVX::Add(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        SimdAVX::Constant((short)((ulong)in_stack_fffffffffffffb10 >> 0x20));
        in_stack_fffffffffffffb08 = b_00;
        SimdAVX::Add(a,b_00);
        SimdAVX::Rli(in_stack_fffffffffffffb08,(int)((ulong)extraout_XMM0_Qa >> 0x20));
        in_RSI = (long *)(local_78 + local_80);
        in_YMM0_H = 0;
        in_register_00001218 = 0;
        SimdAVX::Store(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
        SimdAVX::Empty();
        in_stack_fffffffffffffb00 = extraout_XMM0_Qa;
        in_stack_fffffffffffffb10 = a;
      }
      return;
    }
    __assert_fail("yuv->size_ % kStride == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x21,"virtual void ImplSimd<SimdAVX>::YUV2RGB(YUV420 *, RGB *) [SIMD = SimdAVX]")
    ;
  }
  __assert_fail("yuv->width_ == rgb->width_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                ,0x20,"virtual void ImplSimd<SimdAVX>::YUV2RGB(YUV420 *, RGB *) [SIMD = SimdAVX]");
}

Assistant:

void ImplSimd<SIMD>::YUV2RGB(YUV420 *yuv, RGB *rgb) {
  assert(yuv->height_ == rgb->height_);
  assert(yuv->width_ == rgb->width_);
  assert(yuv->size_ % kStride == 0);

  auto y = yuv->y_;
  auto u = yuv->u_;
  auto v = yuv->v_;
  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  for(size_t i = 0; i < yuv->size_; i += kStride){
    Vector c = sub(load(y+i), cn(16));
    Vector d = sub(load(u+i), cn(128));
    Vector e = sub(load(v+i), cn(128));

    /*
    r[i] = clamp((298 * c + 409 * e + 128) >> 8);
    g[i] = clamp((298 * c - 100 * d - 208 * e + 128) >> 8);
    b[i] = clamp((298 * c + 516 * d + 128) >> 8);
     */
    store(rli(add(add(mul(cn(298),c),mul(cn(409),e)),cn(128)), 8), r + i);
    store(rli(add(sub(sub(mul(cn(298),c),mul(cn(100),d)),mul(cn(208),e)), cn(128)), 8), g + i);
    store(rli(add(add(mul(cn(298),c),mul(cn(516),d)),cn(128)), 8), b + i);
    SIMD::Empty();
  }
}